

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<std::tuple<unsigned_int,_Kernel::IntegerConstantType>_>::expand
          (Stack<std::tuple<unsigned_int,_Kernel::IntegerConstantType>_> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  _Tuple_impl<1UL,_Kernel::IntegerConstantType> *p_Var5;
  tuple<unsigned_int,_Kernel::IntegerConstantType> *ptVar6;
  mp_limb_t *pmVar7;
  tuple<unsigned_int,_Kernel::IntegerConstantType> *in_RDI;
  size_t i;
  tuple<unsigned_int,_Kernel::IntegerConstantType> *newStack;
  void *mem;
  size_t newCapacity;
  tuple<unsigned_int,_Kernel::IntegerConstantType> *ptVar8;
  ulong local_28;
  
  p_Var5 = &(in_RDI->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
            super__Tuple_impl<1UL,_Kernel::IntegerConstantType>;
  lVar1._0_4_ = (p_Var5->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl.
                _val[0]._mp_alloc;
  lVar1._4_4_ = (p_Var5->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl.
                _val[0]._mp_size;
  if (lVar1 == 0) {
    ptVar6 = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)0x8;
  }
  else {
    p_Var5 = &(in_RDI->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
              super__Tuple_impl<1UL,_Kernel::IntegerConstantType>;
    lVar2._0_4_ = (p_Var5->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl.
                  _val[0]._mp_alloc;
    lVar2._4_4_ = (p_Var5->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl.
                  _val[0]._mp_size;
    ptVar6 = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)(lVar2 << 1);
  }
  ptVar8 = ptVar6;
  pmVar7 = (mp_limb_t *)Lib::alloc((size_t)in_RDI);
  p_Var5 = &(in_RDI->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
            super__Tuple_impl<1UL,_Kernel::IntegerConstantType>;
  lVar3._0_4_ = (p_Var5->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl.
                _val[0]._mp_alloc;
  lVar3._4_4_ = (p_Var5->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl.
                _val[0]._mp_size;
  if (lVar3 != 0) {
    for (local_28 = 0;
        p_Var5 = &(in_RDI->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
                  super__Tuple_impl<1UL,_Kernel::IntegerConstantType>,
        uVar4._0_4_ = (p_Var5->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>).
                      _M_head_impl._val[0]._mp_alloc,
        uVar4._4_4_ = (p_Var5->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>).
                      _M_head_impl._val[0]._mp_size, local_28 < uVar4; local_28 = local_28 + 1) {
      std::tuple<unsigned_int,_Kernel::IntegerConstantType>::tuple(in_RDI,ptVar8);
      std::tuple<unsigned_int,_Kernel::IntegerConstantType>::~tuple
                ((tuple<unsigned_int,_Kernel::IntegerConstantType> *)0x8cddaa);
    }
    Lib::free((in_RDI->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
              super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
              super__Head_base<1UL,_Kernel::IntegerConstantType,_false>._M_head_impl._val[0]._mp_d);
  }
  (in_RDI->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
  super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
  super__Head_base<1UL,_Kernel::IntegerConstantType,_false>._M_head_impl._val[0]._mp_d = pmVar7;
  *(mp_limb_t **)
   &(in_RDI->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
    super__Head_base<0UL,_unsigned_int,_false> =
       (in_RDI->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
       super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
       super__Head_base<1UL,_Kernel::IntegerConstantType,_false>._M_head_impl._val[0]._mp_d +
       *(long *)(in_RDI->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
                super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
                super__Head_base<1UL,_Kernel::IntegerConstantType,_false>._M_head_impl._val * 3;
  *(mp_limb_t **)
   in_RDI[1].super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>.
   super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
   super__Head_base<1UL,_Kernel::IntegerConstantType,_false>._M_head_impl._val =
       (in_RDI->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
       super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
       super__Head_base<1UL,_Kernel::IntegerConstantType,_false>._M_head_impl._val[0]._mp_d +
       (long)ptVar6 * 3;
  *(tuple<unsigned_int,_Kernel::IntegerConstantType> **)
   (in_RDI->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
   super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
   super__Head_base<1UL,_Kernel::IntegerConstantType,_false>._M_head_impl._val = ptVar6;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }